

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  ZSTD_CCtx_params params_00;
  ZSTD_CCtx_params params_01;
  U32 UVar7;
  U32 UVar8;
  uint uVar9;
  size_t code;
  long lVar10;
  ZSTD_CCtx_params *pZVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined8 in_stack_fffffffffffffee0;
  undefined1 auVar14 [12];
  undefined1 auVar15 [24];
  undefined1 in_stack_fffffffffffffee8 [104];
  undefined1 auVar16 [24];
  undefined8 local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined8 uStack_90;
  
  if ((cdict == (ZSTD_CDict *)0x0) || (cdict->dictContentSize == 0)) {
    pZVar11 = &params;
    puVar12 = (undefined8 *)&stack0xfffffffffffffed8;
    for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar12 = *(undefined8 *)pZVar11;
      pZVar11 = (ZSTD_CCtx_params *)&(pZVar11->cParams).chainLog;
      puVar12 = puVar12 + 1;
    }
    params_01.cParams.windowLog = in_stack_fffffffffffffedc;
    params_01.format = in_stack_fffffffffffffed8;
    params_01.cParams.chainLog = (int)in_stack_fffffffffffffee0;
    params_01.cParams.hashLog = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
    auVar14 = in_stack_fffffffffffffee8._16_12_;
    auVar15 = in_stack_fffffffffffffee8._52_24_;
    auVar16 = in_stack_fffffffffffffee8._80_24_;
    params_01.cParams.searchLog = in_stack_fffffffffffffee8._0_4_;
    params_01.cParams.searchLength = in_stack_fffffffffffffee8._4_4_;
    params_01.cParams.targetLength = in_stack_fffffffffffffee8._8_4_;
    params_01.cParams.strategy = in_stack_fffffffffffffee8._12_4_;
    params_01.fParams.contentSizeFlag = auVar14._0_4_;
    params_01.fParams.checksumFlag = auVar14._4_4_;
    params_01.fParams.noDictIDFlag = auVar14._8_4_;
    params_01.compressionLevel = in_stack_fffffffffffffee8._28_4_;
    params_01.disableLiteralCompression = in_stack_fffffffffffffee8._32_4_;
    params_01.forceWindow = in_stack_fffffffffffffee8._36_4_;
    params_01.nbWorkers = in_stack_fffffffffffffee8._40_4_;
    params_01.jobSize = in_stack_fffffffffffffee8._44_4_;
    params_01.overlapSizeLog = in_stack_fffffffffffffee8._48_4_;
    params_01.ldmParams.enableLdm = auVar15._0_4_;
    params_01.ldmParams.hashLog = auVar15._4_4_;
    params_01.ldmParams.bucketSizeLog = auVar15._8_4_;
    params_01.ldmParams.minMatchLength = auVar15._12_4_;
    params_01.ldmParams.hashEveryLog = auVar15._16_4_;
    params_01.ldmParams.windowLog = auVar15._20_4_;
    params_01._92_4_ = in_stack_fffffffffffffee8._76_4_;
    params_01.customMem.customAlloc = (ZSTD_allocFunction)auVar16._0_8_;
    params_01.customMem.customFree = (ZSTD_freeFunction)auVar16._8_8_;
    params_01.customMem.opaque = (void *)auVar16._16_8_;
    code = ZSTD_resetCCtx_internal(cctx,params_01,pledgedSrcSize,ZSTDcrp_continue,zbuff);
    if (code < 0xffffffffffffff89) {
      code = ZSTD_compress_insertDictionary
                       ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,&params,dict,
                        dictSize,dictContentType,dtlm,cctx->entropyWorkspace);
      uVar9 = ZSTD_isError(code);
      if (uVar9 == 0) {
        cctx->dictID = (U32)code;
        code = 0;
      }
    }
  }
  else {
    pZVar11 = &params;
    puVar12 = &local_a8;
    for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar12 = *(undefined8 *)pZVar11;
      pZVar11 = (ZSTD_CCtx_params *)&(pZVar11->cParams).chainLog;
      puVar12 = puVar12 + 1;
    }
    uVar1 = (cdict->cParams).chainLog;
    uVar2 = (cdict->cParams).hashLog;
    uVar3 = (cdict->cParams).searchLog;
    uVar4 = (cdict->cParams).searchLength;
    uStack_9c = uVar2;
    uStack_98 = uVar3;
    uStack_94 = uVar4;
    uStack_90._0_4_ = (cdict->cParams).targetLength;
    uStack_90._4_4_ = (cdict->cParams).strategy;
    stack0xffffffffffffff5c = CONCAT44(uVar1,local_a8._4_4_);
    puVar12 = &local_a8;
    puVar13 = (undefined8 *)&stack0xfffffffffffffed8;
    for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar13 = *puVar12;
      puVar12 = puVar12 + 1;
      puVar13 = puVar13 + 1;
    }
    params_00.cParams.windowLog = in_stack_fffffffffffffedc;
    params_00.format = in_stack_fffffffffffffed8;
    params_00.cParams.chainLog = (int)in_stack_fffffffffffffee0;
    params_00.cParams.hashLog = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
    auVar14 = in_stack_fffffffffffffee8._16_12_;
    auVar15 = in_stack_fffffffffffffee8._52_24_;
    auVar16 = in_stack_fffffffffffffee8._80_24_;
    params_00.cParams.searchLog = in_stack_fffffffffffffee8._0_4_;
    params_00.cParams.searchLength = in_stack_fffffffffffffee8._4_4_;
    params_00.cParams.targetLength = in_stack_fffffffffffffee8._8_4_;
    params_00.cParams.strategy = in_stack_fffffffffffffee8._12_4_;
    params_00.fParams.contentSizeFlag = auVar14._0_4_;
    params_00.fParams.checksumFlag = auVar14._4_4_;
    params_00.fParams.noDictIDFlag = auVar14._8_4_;
    params_00.compressionLevel = in_stack_fffffffffffffee8._28_4_;
    params_00.disableLiteralCompression = in_stack_fffffffffffffee8._32_4_;
    params_00.forceWindow = in_stack_fffffffffffffee8._36_4_;
    params_00.nbWorkers = in_stack_fffffffffffffee8._40_4_;
    params_00.jobSize = in_stack_fffffffffffffee8._44_4_;
    params_00.overlapSizeLog = in_stack_fffffffffffffee8._48_4_;
    params_00.ldmParams.enableLdm = auVar15._0_4_;
    params_00.ldmParams.hashLog = auVar15._4_4_;
    params_00.ldmParams.bucketSizeLog = auVar15._8_4_;
    params_00.ldmParams.minMatchLength = auVar15._12_4_;
    params_00.ldmParams.hashEveryLog = auVar15._16_4_;
    params_00.ldmParams.windowLog = auVar15._20_4_;
    params_00._92_4_ = in_stack_fffffffffffffee8._76_4_;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar16._0_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)auVar16._8_8_;
    params_00.customMem.opaque = (void *)auVar16._16_8_;
    ZSTD_resetCCtx_internal(cctx,params_00,pledgedSrcSize,ZSTDcrp_noMemset,zbuff);
    if ((cdict->cParams).strategy == ZSTD_fast) {
      lVar10 = 0;
    }
    else {
      lVar10 = 1L << ((byte)(cdict->cParams).chainLog & 0x3f);
    }
    memcpy((cctx->blockState).matchState.hashTable,(cdict->matchState).hashTable,
           ((1L << ((byte)(cdict->cParams).hashLog & 0x3f)) + lVar10) * 4);
    code = 0;
    memset((cctx->blockState).matchState.hashTable3,0,
           4L << ((byte)(cctx->blockState).matchState.hashLog3 & 0x3f));
    pBVar5 = (cdict->matchState).window.base;
    pBVar6 = (cdict->matchState).window.dictBase;
    UVar7 = (cdict->matchState).window.dictLimit;
    UVar8 = (cdict->matchState).window.lowLimit;
    (cctx->blockState).matchState.window.nextSrc = (cdict->matchState).window.nextSrc;
    (cctx->blockState).matchState.window.base = pBVar5;
    (cctx->blockState).matchState.window.dictBase = pBVar6;
    (cctx->blockState).matchState.window.dictLimit = UVar7;
    (cctx->blockState).matchState.window.lowLimit = UVar8;
    (cctx->blockState).matchState.nextToUpdate3 = (cdict->matchState).nextToUpdate3;
    UVar7 = (cdict->matchState).nextToUpdate;
    (cctx->blockState).matchState.loadedDictEnd = (cdict->matchState).loadedDictEnd;
    (cctx->blockState).matchState.nextToUpdate = UVar7;
    cctx->dictID = cdict->dictID;
    memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x11f0);
  }
  return code;
}

Assistant:

size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                             const void* dict, size_t dictSize,
                             ZSTD_dictContentType_e dictContentType,
                             ZSTD_dictTableLoadMethod_e dtlm,
                             const ZSTD_CDict* cdict,
                             ZSTD_CCtx_params params, U64 pledgedSrcSize,
                             ZSTD_buffered_policy_e zbuff)
{
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params.cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    if (cdict && cdict->dictContentSize>0) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    CHECK_F( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     ZSTDcrp_continue, zbuff) );
    {
        size_t const dictID = ZSTD_compress_insertDictionary(
                cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                &params, dict, dictSize, dictContentType, dtlm, cctx->entropyWorkspace);
        if (ZSTD_isError(dictID)) return dictID;
        assert(dictID <= (size_t)(U32)-1);
        cctx->dictID = (U32)dictID;
    }
    return 0;
}